

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void y_convolve_4tap_32x2_avx2
               (uint8_t *src,ptrdiff_t stride,__m256i *coeffs,__m256i *s_256,__m256i *ss_256,
               __m256i *tt_256,__m256i *r)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  
  alVar1 = *(__m256i *)(src + stride);
  s_256[3] = alVar1;
  alVar1 = (__m256i)vpunpcklbw_avx2((undefined1  [32])s_256[2],(undefined1  [32])alVar1);
  ss_256[1] = alVar1;
  alVar1 = (__m256i)vpunpckhbw_avx2((undefined1  [32])s_256[2],(undefined1  [32])s_256[3]);
  ss_256[3] = alVar1;
  alVar1 = *(__m256i *)(src + stride * 2);
  s_256[2] = alVar1;
  alVar1 = (__m256i)vpunpcklbw_avx2((undefined1  [32])s_256[3],(undefined1  [32])alVar1);
  tt_256[1] = alVar1;
  alVar1 = (__m256i)vpunpckhbw_avx2((undefined1  [32])s_256[3],(undefined1  [32])s_256[2]);
  tt_256[3] = alVar1;
  auVar2 = vpmaddubsw_avx2((undefined1  [32])*ss_256,(undefined1  [32])*coeffs);
  auVar3 = vpmaddubsw_avx2((undefined1  [32])ss_256[1],(undefined1  [32])coeffs[1]);
  alVar1 = (__m256i)vpaddw_avx2(auVar3,auVar2);
  *r = alVar1;
  auVar2 = vpmaddubsw_avx2((undefined1  [32])ss_256[2],(undefined1  [32])*coeffs);
  auVar3 = vpmaddubsw_avx2((undefined1  [32])ss_256[3],(undefined1  [32])coeffs[1]);
  alVar1 = (__m256i)vpaddw_avx2(auVar3,auVar2);
  r[1] = alVar1;
  auVar2 = vpmaddubsw_avx2((undefined1  [32])*tt_256,(undefined1  [32])*coeffs);
  auVar3 = vpmaddubsw_avx2((undefined1  [32])tt_256[1],(undefined1  [32])coeffs[1]);
  alVar1 = (__m256i)vpaddw_avx2(auVar3,auVar2);
  r[2] = alVar1;
  auVar2 = vpmaddubsw_avx2((undefined1  [32])tt_256[2],(undefined1  [32])*coeffs);
  auVar3 = vpmaddubsw_avx2((undefined1  [32])tt_256[3],(undefined1  [32])coeffs[1]);
  alVar1 = (__m256i)vpaddw_avx2(auVar3,auVar2);
  r[3] = alVar1;
  return;
}

Assistant:

static inline void y_convolve_4tap_32x2_avx2(
    const uint8_t *const src, const ptrdiff_t stride, const __m256i coeffs[2],
    __m256i s_256[4], __m256i ss_256[4], __m256i tt_256[4], __m256i r[4]) {
  s_256[3] = _mm256_loadu_si256((__m256i *)(src + 1 * stride));
  ss_256[1] = _mm256_unpacklo_epi8(s_256[2], s_256[3]);
  ss_256[3] = _mm256_unpackhi_epi8(s_256[2], s_256[3]);
  s_256[2] = _mm256_loadu_si256((__m256i *)(src + 2 * stride));
  tt_256[1] = _mm256_unpacklo_epi8(s_256[3], s_256[2]);
  tt_256[3] = _mm256_unpackhi_epi8(s_256[3], s_256[2]);
  r[0] = convolve_4tap_avx2(ss_256 + 0, coeffs);
  r[1] = convolve_4tap_avx2(ss_256 + 2, coeffs);
  r[2] = convolve_4tap_avx2(tt_256 + 0, coeffs);
  r[3] = convolve_4tap_avx2(tt_256 + 2, coeffs);
}